

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixCase::createInstance(ShaderMatrixCase *this,Context *context)

{
  ulong uVar1;
  bool isVertexCase;
  Precision PVar2;
  Precision PVar3;
  MatrixOp MVar4;
  int iVar5;
  ShaderEvaluator *evaluator;
  _func_int **pp_Var6;
  undefined8 uVar7;
  float *pfVar8;
  int iVar9;
  OperationType OVar10;
  ShaderRenderCaseInstance *this_00;
  TestInstance *pTVar11;
  ShaderRenderCaseInstance *pSVar12;
  InternalError *this_01;
  deUint32 bindingLocation;
  float *pfVar13;
  ulong uVar14;
  UniformSetup *pUVar15;
  int row;
  long lVar16;
  int row_2;
  long lVar17;
  float *pfVar18;
  int row_1;
  long lVar19;
  UniformSetup local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x230);
  isVertexCase = (this->super_ShaderRenderCase).m_isVertexCase;
  evaluator = (this->super_ShaderRenderCase).m_evaluator.
              super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              .m_data.ptr;
  pp_Var6 = *(_func_int ***)&this->m_in0;
  PVar2 = (this->m_in0).precision;
  PVar3 = (this->m_in1).precision;
  uVar7 = *(undefined8 *)&this->m_in1;
  MVar4 = this->m_op;
  UniformSetup::UniformSetup(&local_78,(UniformSetupFunc)0x0);
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,isVertexCase,evaluator,&local_78,(AttributeSetupFunc)0x0,
             IMAGE_BACKING_MODE_REGULAR,(uint)(byte)(MVar4 == OP_INVERSE & isVertexCase) << 6);
  UniformSetup::~UniformSetup(&local_78);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d2c908;
  this_00[1].super_TestInstance._vptr_TestInstance = pp_Var6;
  *(Precision *)&this_00[1].super_TestInstance.m_context = PVar2;
  *(undefined8 *)((long)&this_00[1].super_TestInstance.m_context + 4) = uVar7;
  this_00[1].m_quadGridSize = PVar3;
  *(MatrixOp *)
   &this_00[1].m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.ptr = MVar4;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&this_00->m_userAttribTransforms,4);
  pfVar8 = (float *)(this_00->m_userAttribTransforms).
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pfVar13 = pfVar8;
  uVar14 = 0;
  do {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78._vptr_UniformSetup = (_func_int **)0x0;
    local_78.m_setupFunc = (UniformSetupFunc)0x0;
    lVar16 = 0;
    pUVar15 = &local_78;
    do {
      lVar17 = 0;
      do {
        *(undefined4 *)((long)&pUVar15->_vptr_UniformSetup + lVar17) = 0;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x40);
      lVar16 = lVar16 + 1;
      pUVar15 = (UniformSetup *)((long)&pUVar15->_vptr_UniformSetup + 4);
    } while (lVar16 != 4);
    lVar16 = 0;
    pUVar15 = &local_78;
    pfVar18 = pfVar13;
    do {
      lVar17 = 0;
      do {
        *(undefined4 *)((long)pfVar18 + lVar17) =
             *(undefined4 *)((long)&pUVar15->_vptr_UniformSetup + lVar17);
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x40);
      lVar16 = lVar16 + 1;
      pfVar18 = pfVar18 + 1;
      pUVar15 = (UniformSetup *)((long)&pUVar15->_vptr_UniformSetup + 4);
    } while (lVar16 != 4);
    (pfVar8 + uVar14 * 0x10 + 0xc)[0] = 0.2;
    (pfVar8 + uVar14 * 0x10 + 0xc)[1] = 0.1;
    pfVar8[uVar14 * 0x10 + 0xe] = (float)(int)uVar14 * 0.15 + 0.4;
    pfVar8[uVar14 * 0x10 + 0xf] = 0.7;
    pfVar8[uVar14 * 0x11] = 1.0;
    uVar1 = uVar14 + 1;
    pfVar8[uVar14 * 0x10 + (ulong)((uint)uVar1 & 3) + 4] = 1.0;
    pfVar8[uVar14 * 0x10 + (uVar14 ^ 2) + 8] = 1.0;
    pfVar8[uVar14 * 0x10 + (ulong)((int)uVar14 - 1U & 3) + 0xc] = 1.0;
    pfVar13 = pfVar13 + 0x10;
    uVar14 = uVar1;
  } while (uVar1 != 4);
  MVar4 = *(MatrixOp *)
           &this_00[1].m_sparseContext.
            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
            .m_data.ptr;
  switch(MVar4) {
  case OP_ADD:
  case OP_SUB:
  case OP_MUL:
  case OP_DIV:
  case OP_COMP_MUL:
  case OP_OUTER_PRODUCT:
  case OP_TRANSPOSE:
  case OP_INVERSE:
  case OP_DETERMINANT:
  case OP_POST_DECREMENT:
  case OP_ADD_INTO:
    goto switchD_005b0c2a_caseD_0;
  case OP_UNARY_PLUS:
  case OP_DIVIDE_INTO:
    iVar9 = 3;
    break;
  case OP_NEGATION:
    iVar9 = 4;
    break;
  case OP_PRE_INCREMENT:
  case OP_POST_INCREMENT:
  case OP_MULTIPLY_INTO:
    iVar9 = 1;
    break;
  case OP_PRE_DECREMENT:
    iVar9 = 2;
    break;
  case OP_SUBTRACT_FROM:
    iVar9 = 5;
    break;
  default:
    iVar9 = 6;
  }
  lVar16 = 0;
  do {
    lVar17 = 0;
    do {
      lVar19 = 0;
      do {
        if (iVar9 - 1U < 5) {
          pTVar11 = (TestInstance *)
                    (*(code *)((long)&DAT_00b1f70c + (long)(int)(&DAT_00b1f70c)[iVar9 - 1U]))
                              (0x80000000,0x3e99999a,0xbe99999a,0xbdcccccd);
          return pTVar11;
        }
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x40);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
switchD_005b0c2a_caseD_0:
  OVar10 = MatrixCaseUtils::getOperationType(MVar4);
  iVar9 = 1;
  if (OVar10 < OPERATIONTYPE_LAST) {
    iVar9 = *(int *)(&DAT_00b1fb80 + (ulong)OVar10 * 4);
  }
  bindingLocation = 4;
  do {
    pSVar12 = (ShaderRenderCaseInstance *)((long)&this_00[1].super_TestInstance.m_context + 4);
    if (bindingLocation == 4) {
      pSVar12 = this_00 + 1;
    }
    if (*(int *)&(pSVar12->super_TestInstance)._vptr_TestInstance == 2) {
      iVar5 = *(int *)((long)&(pSVar12->super_TestInstance)._vptr_TestInstance + 4);
      if (iVar5 - 5U < 9 || iVar5 - 0x12U < 9) {
        if (8 < iVar5 - 5U) {
          this_01 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_01,"Not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderMatrixTests.cpp"
                     ,0x563);
          __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        ShaderRenderCaseInstance::useAttribute(this_00,bindingLocation,iVar5 - A_IN1);
      }
    }
    iVar5 = bindingLocation - iVar9;
    bindingLocation = bindingLocation + 1;
  } while (iVar5 != 3);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ShaderMatrixCase::createInstance (Context& context) const
{
	return new ShaderMatrixInstance(context, m_isVertexCase, *m_evaluator, m_in0, m_in1, m_op);
}